

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserDecorator.cpp
# Opt level: O3

bool __thiscall
Rml::PropertyParserDecorator::ParseValue
          (PropertyParserDecorator *this,Property *property,String *decorator_string_value,
          ParameterMap *param_3)

{
  pointer pDVar1;
  code *pcVar2;
  flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
  *this_00;
  Property *this_01;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  const_iterator cVar7;
  DecoratorInstancer *pDVar8;
  PropertySpecification *this_02;
  pointer pDVar9;
  pointer pbVar10;
  undefined8 uVar11;
  char cVar12;
  _Alloc_hider _Var13;
  BoxArea BVar14;
  element_type *peVar15;
  String type;
  StringList keywords;
  DecoratorDeclarationList decorators;
  String shorthand;
  StringList decorator_string_list;
  undefined1 local_1a8 [72];
  size_t local_160;
  undefined8 uStack_158;
  BoxArea local_150;
  String local_148;
  undefined1 local_128 [32];
  size_t local_108;
  undefined8 uStack_100;
  vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_> local_f8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  pointer pDStack_c8;
  String local_b8;
  StringList local_98;
  String local_78;
  Property *local_58;
  pointer local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if ((decorator_string_value->_M_string_length == 0) ||
     (iVar4 = ::std::__cxx11::string::compare((char *)decorator_string_value), iVar4 == 0)) {
    local_f8.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_1a8,(DecoratorsPtr *)&local_f8);
    Variant::operator=(&property->value,(Variant *)local_1a8);
    Variant::~Variant((Variant *)local_1a8);
    if (local_f8.
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    property->unit = DECORATOR;
    bVar3 = true;
  }
  else {
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    StringUtilities::ExpandString(&local_98,decorator_string_value,',','(',')',false);
    local_f8.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8.
    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e0 = &local_d0;
    local_d8 = 0;
    local_d0 = 0;
    local_58 = property;
    ::std::__cxx11::string::_M_assign((string *)&local_e0);
    ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::reserve
              (&local_f8,
               (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_98.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_50 = local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        cVar12 = (char)pbVar10;
        uVar5 = ::std::__cxx11::string::find(cVar12,0x28);
        uVar6 = ::std::__cxx11::string::rfind(cVar12,0x29);
        if (uVar5 < uVar6 && uVar6 != 0xffffffffffffffff) {
          local_40 = uVar6 + 1;
        }
        else {
          local_40 = ::std::__cxx11::string::find(cVar12,0x20);
        }
        local_128._0_8_ = (element_type *)0x0;
        local_128._8_8_ = (element_type *)0x0;
        local_128._16_8_ = (pointer)0x0;
        BVar14 = Auto;
        local_48 = uVar6;
        local_38 = uVar5;
        if (local_40 < pbVar10->_M_string_length) {
          ::std::__cxx11::string::substr((ulong)local_1a8,(ulong)pbVar10);
          StringUtilities::ExpandString((StringList *)local_128,(String *)local_1a8,' ');
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          uVar11 = local_128._8_8_;
          if (local_128._0_8_ != local_128._8_8_) {
            BVar14 = Auto;
            peVar15 = (element_type *)local_128._0_8_;
            do {
              pDVar9 = (peVar15->list).
                       super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (pDVar9 != (pointer)0x0) {
                if (DAT_0033b7f8 ==
                    (flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                     *)0x0) {
                  bVar3 = Assert("Resource used before it was initialized, or after it was shut down."
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                                 ,0x46);
                  if (!bVar3) goto LAB_002550dd;
                  pDVar9 = (peVar15->list).
                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
                this_00 = DAT_0033b7f8;
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                pDVar1 = (peVar15->list).
                         super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_78,pDVar1,
                           (long)&(pDVar9->type)._M_dataplus._M_p + (long)&pDVar1->type);
                StringUtilities::ToLower(&local_78);
                cVar7 = itlib::
                        flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                        ::find<std::__cxx11::string>
                                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_1a8);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity + 1);
                }
                if ((DAT_0033b7f8 ==
                     (flat_map<std::__cxx11::string,Rml::BoxArea,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::BoxArea>,std::allocator<std::pair<std::__cxx11::string,Rml::BoxArea>>>>
                      *)0x0) &&
                   (bVar3 = Assert("Resource used before it was initialized, or after it was shut down."
                                   ,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                                   ,0x46), !bVar3)) {
LAB_002550dd:
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                if (cVar7._M_current ==
                    *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::BoxArea>
                      **)(DAT_0033b7f8 + 8)) {
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_128);
                  bVar3 = false;
                  goto LAB_00255092;
                }
                BVar14 = (cVar7._M_current)->second;
              }
              peVar15 = (element_type *)&(peVar15->value)._M_string_length;
            } while (peVar15 != (element_type *)uVar11);
          }
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
        if (uVar5 < uVar6 && uVar6 != 0xffffffffffffffff) {
          ::std::__cxx11::string::substr((ulong)local_1a8,(ulong)pbVar10);
          StringUtilities::StripWhitespace(&local_148,(String *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pDVar8 = Factory::GetDecoratorInstancer(&local_148);
          if (pDVar8 == (DecoratorInstancer *)0x0) {
            Log::Message(LT_WARNING,"Decorator type \'%s\' not found.",local_148._M_dataplus._M_p);
LAB_0025506e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00255090;
          }
          ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)pbVar10);
          this_02 = EffectSpecification::GetPropertySpecification
                              (&pDVar8->super_EffectSpecification);
          PropertyDictionary::PropertyDictionary((PropertyDictionary *)local_128);
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"decorator","");
          bVar3 = PropertySpecification::ParsePropertyDeclaration
                            (this_02,(PropertyDictionary *)local_128,(String *)local_1a8,&local_b8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (!bVar3) {
            StringUtilities::StripWhitespace((String *)local_1a8,&local_b8);
            uVar11 = local_1a8._8_8_;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (uVar11 != 0) {
              robin_hood::detail::
              Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
              ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                         *)local_128);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              goto LAB_0025506e;
            }
          }
          PropertySpecification::SetPropertyDefaults(this_02,(PropertyDictionary *)local_128);
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,local_148._M_dataplus._M_p,
                     local_148._M_dataplus._M_p + local_148._M_string_length);
          local_1a8._40_8_ = local_1a8 + 0x40;
          local_1a8._56_8_ = (pointer)0x0;
          local_1a8._64_8_ = 0;
          local_160 = 0;
          uStack_158._0_4_ = 0x20;
          uStack_158._4_4_ = 0;
          local_1a8._48_8_ = local_1a8._40_8_;
          if (local_128._24_8_ != 0) {
            local_1a8._40_8_ = local_128._0_8_;
            local_1a8._48_8_ = local_128._8_8_;
            local_1a8._56_8_ = local_128._16_8_;
            local_1a8._64_8_ = local_128._24_8_;
            local_160 = local_108;
            uStack_158._0_4_ = (InfoType)uStack_100;
            uStack_158._4_4_ = uStack_100._4_4_;
            local_128._0_8_ = local_128 + 0x18;
            local_128._16_8_ = (pointer)0x0;
            local_128._24_8_ = 0;
            local_108 = 0;
            uStack_100._0_4_ = 0x20;
            uStack_100._4_4_ = 0;
            local_128._8_8_ = local_128._0_8_;
          }
          local_1a8._32_8_ = pDVar8;
          local_150 = BVar14;
          ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
          emplace_back<Rml::DecoratorDeclaration>(&local_f8,(DecoratorDeclaration *)local_1a8);
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)(local_1a8 + 0x28));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          uVar11 = local_148.field_2._M_allocated_capacity;
          _Var13._M_p = local_148._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_00254e70;
        }
        else {
          ::std::__cxx11::string::substr((ulong)local_1a8,(ulong)pbVar10);
          local_1a8._32_8_ = (DecoratorInstancer *)0x0;
          PropertyDictionary::PropertyDictionary((PropertyDictionary *)(local_1a8 + 0x28));
          local_150 = BVar14;
          ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::
          emplace_back<Rml::DecoratorDeclaration>(&local_f8,(DecoratorDeclaration *)local_1a8);
          robin_hood::detail::
          Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
          ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                     *)(local_1a8 + 0x28));
          uVar11 = local_1a8._16_8_;
          _Var13._M_p = (pointer)local_1a8._0_8_;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
LAB_00254e70:
            operator_delete(_Var13._M_p,uVar11 + 1);
          }
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != local_50);
    }
    if (local_f8.
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_f8.
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
LAB_00255090:
      bVar3 = false;
    }
    else {
      local_128._8_8_ = operator_new(0x48);
      this_01 = local_58;
      (((element_type *)local_128._8_8_)->list).
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000001;
      (((element_type *)local_128._8_8_)->list).
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR___Sp_counted_ptr_inplace_0032f730;
      local_128._0_8_ =
           &(((element_type *)local_128._8_8_)->list).
            super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (((element_type *)local_128._8_8_)->list).
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_f8.
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (((element_type *)local_128._8_8_)->value)._M_dataplus._M_p =
           (pointer)local_f8.
                    super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      (((element_type *)local_128._8_8_)->value)._M_string_length =
           (size_type)
           local_f8.
           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_f8.
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.
      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (((element_type *)local_128._8_8_)->value).field_2._M_allocated_capacity =
           (size_type)(local_128._8_8_ + 0x38);
      if (local_e0 == &local_d0) {
        (((element_type *)(local_128._8_8_ + 0x38))->list).
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_cf,local_d0);
        (((element_type *)(local_128._8_8_ + 0x38))->list).
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_finish = pDStack_c8;
      }
      else {
        (((element_type *)local_128._8_8_)->value).field_2._M_allocated_capacity =
             (size_type)local_e0;
        (((element_type *)(local_128._8_8_ + 0x38))->list).
        super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_cf,local_d0);
      }
      *(undefined8 *)((long)&(((element_type *)local_128._8_8_)->value).field_2 + 8) = local_d8;
      local_d8 = 0;
      local_d0 = 0;
      local_e0 = &local_d0;
      Variant::Variant<std::shared_ptr<Rml::DecoratorDeclarationList>,void>
                ((Variant *)local_1a8,(shared_ptr<Rml::DecoratorDeclarationList> *)local_128);
      Variant::operator=(&this_01->value,(Variant *)local_1a8);
      Variant::~Variant((Variant *)local_1a8);
      if ((element_type *)local_128._8_8_ != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
      this_01->unit = DECORATOR;
      bVar3 = true;
    }
LAB_00255092:
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
    }
    ::std::vector<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>::~vector
              (&local_f8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
  }
  return bVar3;
}

Assistant:

bool PropertyParserDecorator::ParseValue(Property& property, const String& decorator_string_value, const ParameterMap& /*parameters*/) const
{
	// Decorators are declared as
	//   decorator: <decorator-value>[, <decorator-value> ...];
	// Where <decorator-value> is either a @decorator name:
	//   decorator: invader-theme-background <paint-area>?, ...;
	// or is an anonymous decorator with inline properties
	//   decorator: tiled-box( <shorthand properties> ) <paint-area>?, ...;
	// where <paint-area> is one of
	//   border-box, padding-box, content-box

	if (decorator_string_value.empty() || decorator_string_value == "none")
	{
		property.value = Variant(DecoratorsPtr());
		property.unit = Unit::DECORATOR;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in decorator shorthands.
	StringList decorator_string_list;
	StringUtilities::ExpandString(decorator_string_list, decorator_string_value, ',', '(', ')');

	DecoratorDeclarationList decorators;
	decorators.value = decorator_string_value;
	decorators.list.reserve(decorator_string_list.size());

	// Get or instance each decorator in the comma-separated string list
	for (const String& decorator_string : decorator_string_list)
	{
		const size_t shorthand_open = decorator_string.find('(');
		const size_t shorthand_close = decorator_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);
		const size_t keywords_begin = (invalid_parenthesis ? decorator_string.find(' ') : shorthand_close + 1);

		// Look-up keywords for customized paint area.
		BoxArea paint_area = BoxArea::Auto;

		{
			StringList keywords;
			if (keywords_begin < decorator_string.size())
				StringUtilities::ExpandString(keywords, decorator_string.substr(keywords_begin), ' ');

			for (const String& keyword : keywords)
			{
				if (keyword.empty())
					continue;

				auto it = parser_data->area_keywords.find(StringUtilities::ToLower(keyword));
				if (it == parser_data->area_keywords.end())
					return false; // Bail out if we have an invalid keyword.

				paint_area = it->second;
			}
		}

		if (invalid_parenthesis)
		{
			// We found no parenthesis, that means the value must be a name of a @decorator rule.
			decorators.list.emplace_back(DecoratorDeclaration{decorator_string.substr(0, keywords_begin), nullptr, {}, paint_area});
		}
		else
		{
			// Since we have parentheses it must be an anonymous decorator with inline properties
			const String type = StringUtilities::StripWhitespace(decorator_string.substr(0, shorthand_open));

			// Check for valid decorator type
			DecoratorInstancer* instancer = Factory::GetDecoratorInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Decorator type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = decorator_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'decorator' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "decorator", shorthand))
			{
				// Empty values are allowed in decorators, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			decorators.list.emplace_back(DecoratorDeclaration{type, instancer, std::move(properties), paint_area});
		}
	}

	if (decorators.list.empty())
		return false;

	property.value = Variant(MakeShared<DecoratorDeclarationList>(std::move(decorators)));
	property.unit = Unit::DECORATOR;

	return true;
}